

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynom.cpp
# Opt level: O3

Polynom<Rational> __thiscall
Polynom<Rational>::ordinalSub(Polynom<Rational> *this,Polynom<Rational> *a)

{
  uint uVar1;
  pointer puVar2;
  bool bVar3;
  char cVar4;
  compare_t cVar5;
  matrix_error *this_00;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  Polynom<Rational> *in_RDX;
  Rational *extraout_RDX;
  Rational *pRVar9;
  Rational *extraout_RDX_00;
  long lVar10;
  pointer *ppuVar11;
  BigInteger *pBVar12;
  Polynom<Rational> PVar13;
  Polynom<Rational> res;
  Matrix<Rational> m;
  BigInteger mid;
  BigInteger r;
  BigInteger l;
  BigInteger local_138;
  BigInteger local_118;
  Polynom<Rational> *local_f8;
  Matrix<Rational> local_f0;
  BigInteger local_e0;
  BigInteger local_c0;
  BigInteger local_a0;
  ulong local_80;
  ulong local_78;
  BigInteger local_70;
  BigInteger local_50;
  
  local_f8 = a;
  bVar3 = isOrdinal(a);
  if ((!bVar3) || (bVar3 = isOrdinal(in_RDX), !bVar3)) {
    this_00 = (matrix_error *)__cxa_allocate_exception(0x10);
    matrix_error::runtime_error(this_00,"Invalid ordinal");
    __cxa_throw(this_00,&matrix_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar1 = (local_f8->m).N;
  if ((ulong)uVar1 != 0) {
    pRVar9 = (local_f8->m).arr;
    uVar8 = -uVar1;
    lVar10 = 0;
    do {
      if (*(long *)((long)&(pRVar9->_numerator).digits.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar10) !=
          *(long *)((long)&(pRVar9->_numerator).digits.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish + lVar10)) {
        if ((int)uVar8 < 0) {
          uVar1 = (in_RDX->m).N;
          if ((ulong)uVar1 == 0) goto LAB_0013e2ea;
          ppuVar11 = &(((in_RDX->m).arr)->_numerator).digits.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          uVar7 = 0;
          goto LAB_0013e2a9;
        }
        break;
      }
      uVar8 = uVar8 + 1;
      lVar10 = lVar10 + 0x40;
    } while ((ulong)uVar1 << 6 != lVar10);
  }
  goto LAB_0013e2cd;
  while( true ) {
    uVar7 = uVar7 + 1;
    ppuVar11 = ppuVar11 + 8;
    if (uVar1 == uVar7) break;
LAB_0013e2a9:
    if (((_Vector_impl_data *)(ppuVar11 + -1))->_M_start != *ppuVar11) {
      iVar6 = ~(uint)uVar7 + uVar1;
      goto LAB_0013e2c9;
    }
  }
  iVar6 = -1;
LAB_0013e2c9:
  if (iVar6 <= (int)~uVar8) {
LAB_0013e2ea:
    Matrix<Rational>::Matrix(&local_f0,1,-uVar8);
    local_80 = (ulong)~uVar8;
    uVar7 = 0;
    do {
      BigInteger::BigInteger(&local_a0,0);
      BigInteger::BigInteger(&local_c0,1);
      local_78 = uVar7;
      while( true ) {
        BigInteger::BigInteger(&local_70,1);
        ::operator-(&local_e0,&local_c0,&local_70);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&local_138.digits,&local_e0.digits);
        local_138.negative = local_e0.negative;
        BigInteger::BigInteger(&local_118,1);
        pRVar9 = local_f0.arr;
        puVar2 = local_f0.arr[uVar7]._numerator.digits.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_f0.arr[uVar7]._numerator.digits.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
        local_f0.arr[uVar7]._numerator.digits.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        local_f0.arr[uVar7]._numerator.digits.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (puVar2 != (pointer)0x0) {
          operator_delete(puVar2);
        }
        pRVar9[uVar7]._numerator.negative = local_138.negative;
        puVar2 = pRVar9[uVar7]._denominator.digits.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pRVar9[uVar7]._denominator.digits.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_118.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
        pRVar9[uVar7]._denominator.digits.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_118.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        pRVar9[uVar7]._denominator.digits.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_118.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_118.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_118.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_118.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (puVar2 == (pointer)0x0) {
          pRVar9[uVar7]._denominator.negative = local_118.negative;
        }
        else {
          operator_delete(puVar2);
          pRVar9[uVar7]._denominator.negative = local_118.negative;
          if (local_118.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_118.digits.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
        }
        if (local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_138.digits.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_e0.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_e0.digits.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_70.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_70.digits.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        Polynom(this,&local_f0);
        ordinalAdd((Polynom<Rational> *)&local_138,in_RDX);
        cVar5 = ordinalCmp(local_f8,(Polynom<Rational> *)&local_138);
        Matrix<Rational>::~Matrix((Matrix<Rational> *)&local_138);
        cVar4 = '\x01';
        if (cVar5 != CMP_EQUAL) {
          Matrix<Rational>::~Matrix(&this->m);
          cVar4 = (cVar5 == CMP_LESS) * '\x05';
        }
        if (cVar4 != '\0') break;
        BigInteger::BigInteger(&local_50,2);
        BigInteger::operator*=(&local_c0,&local_50);
        if (local_50.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_50.digits.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
      if (cVar4 == '\x05') {
        do {
          BigInteger::BigInteger(&local_e0,1);
          ::operator+(&local_138,&local_a0,&local_e0);
          cVar5 = BigInteger::_compare(&local_138,&local_c0);
          if (local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_138.digits.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_e0.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_e0.digits.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (cVar5 != CMP_LESS) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      (&local_138.digits,&local_a0.digits);
            local_138.negative = local_a0.negative;
            BigInteger::BigInteger(&local_118,1);
            pRVar9 = local_f0.arr;
            puVar2 = local_f0.arr[uVar7]._numerator.digits.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            local_f0.arr[uVar7]._numerator.digits.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
            local_f0.arr[uVar7]._numerator.digits.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            local_f0.arr[uVar7]._numerator.digits.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
            local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_start = (pointer)0x0;
            local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_finish = (pointer)0x0;
            local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            if (puVar2 != (pointer)0x0) {
              operator_delete(puVar2);
            }
            pRVar9[uVar7]._numerator.negative = local_138.negative;
            puVar2 = pRVar9[uVar7]._denominator.digits.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pRVar9[uVar7]._denominator.digits.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_118.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
            pRVar9[uVar7]._denominator.digits.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_118.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            pRVar9[uVar7]._denominator.digits.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_118.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
            local_118.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_start = (pointer)0x0;
            local_118.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_finish = (pointer)0x0;
            local_118.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            if (puVar2 == (pointer)0x0) {
              pRVar9[uVar7]._denominator.negative = local_118.negative;
            }
            else {
              operator_delete(puVar2);
              pRVar9[uVar7]._denominator.negative = local_118.negative;
              if (local_118.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_118.digits.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
            }
            if (local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_138.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            bVar3 = true;
            goto LAB_0013e7f4;
          }
          ::operator+(&local_138,&local_a0,&local_c0);
          BigInteger::BigInteger(&local_70,2);
          ::operator/(&local_e0,&local_138,&local_70);
          if (local_70.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_70.digits.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_138.digits.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (&local_138.digits,&local_e0.digits);
          local_138.negative = local_e0.negative;
          BigInteger::BigInteger(&local_118,1);
          pRVar9 = local_f0.arr;
          puVar2 = local_f0.arr[uVar7]._numerator.digits.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_f0.arr[uVar7]._numerator.digits.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start =
               local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
          local_f0.arr[uVar7]._numerator.digits.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          local_f0.arr[uVar7]._numerator.digits.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
          local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if (puVar2 != (pointer)0x0) {
            operator_delete(puVar2);
          }
          pRVar9[uVar7]._numerator.negative = local_138.negative;
          puVar2 = pRVar9[uVar7]._denominator.digits.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pRVar9[uVar7]._denominator.digits.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start =
               local_118.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
          pRVar9[uVar7]._denominator.digits.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_118.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          pRVar9[uVar7]._denominator.digits.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               local_118.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
          local_118.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_118.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_118.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if (puVar2 == (pointer)0x0) {
            pRVar9[uVar7]._denominator.negative = local_118.negative;
          }
          else {
            operator_delete(puVar2);
            pRVar9[uVar7]._denominator.negative = local_118.negative;
            if (local_118.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_118.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
          }
          if (local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_138.digits.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          Polynom(this,&local_f0);
          ordinalAdd((Polynom<Rational> *)&local_138,in_RDX);
          cVar5 = ordinalCmp(local_f8,(Polynom<Rational> *)&local_138);
          pBVar12 = &local_138;
          if (cVar5 != CMP_EQUAL) {
            if (cVar5 == CMP_LESS) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                        (&local_c0.digits,&local_e0.digits);
              pBVar12 = &local_c0;
            }
            else {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                        (&local_a0.digits,&local_e0.digits);
              pBVar12 = &local_a0;
            }
            pBVar12->negative = local_e0.negative;
            Matrix<Rational>::~Matrix((Matrix<Rational> *)&local_138);
            pBVar12 = (BigInteger *)this;
          }
          Matrix<Rational>::~Matrix((Matrix<Rational> *)pBVar12);
          if (local_e0.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_e0.digits.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
        } while (cVar5 != CMP_EQUAL);
      }
      bVar3 = false;
LAB_0013e7f4:
      if (local_c0.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c0.digits.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_a0.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0.digits.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (!bVar3) goto LAB_0013e841;
      uVar7 = local_78 + 1;
    } while (local_78 < local_80);
    Polynom(this,&local_f0);
LAB_0013e841:
    Matrix<Rational>::~Matrix(&local_f0);
    pRVar9 = extraout_RDX_00;
    goto LAB_0013e2d5;
  }
LAB_0013e2cd:
  Polynom(this);
  pRVar9 = extraout_RDX;
LAB_0013e2d5:
  PVar13.m.arr = pRVar9;
  PVar13.m._0_8_ = this;
  return (Polynom<Rational>)PVar13.m;
}

Assistant:

const Polynom<Field> Polynom<Field>::ordinalSub(const Polynom &a) const
{
    if(!isOrdinal() || !a.isOrdinal())
        throw matrix_error("Invalid ordinal");
    int d = degree();
    if(d < 0 || d < a.degree())
        return Polynom();
    Matrix<Field> m(1, d + 1);
    for(int coeff = 0; coeff < d + 1; ++coeff)
    {
        BigInteger l = 0, r = 1;
        for(;; r *= 2)
        {
            m[0][coeff] = r - 1;
            Polynom t(m);
            Polynom res = a.ordinalAdd(t);
            compare_t cmp = ordinalCmp(res);
            if(cmp == CMP_EQUAL)
                return t;
            if(cmp == CMP_LESS)
                break;
        }
        while(l + 1 < r)
        {
            BigInteger mid = (l + r) / 2;
            m[0][coeff] = mid;
            Polynom t(m);
            Polynom res = a.ordinalAdd(t);
            compare_t cmp = ordinalCmp(res);
            if(cmp == CMP_EQUAL)
                return t;
            if(cmp == CMP_LESS)
                r = mid;
            else
                l = mid;
        }
        m[0][coeff] = l;
    }
    return Polynom(m);
}